

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere.cpp
# Opt level: O0

double __thiscall phyr::Sphere::solidAngle(Sphere *this,Point3f *p,int nSamples)

{
  double dVar1;
  double *pdVar2;
  Point3<double> *in_RDI;
  double dVar3;
  double cosTheta;
  double sinTheta2;
  Point3f pCenter;
  Point3<double> *in_stack_ffffffffffffff90;
  double local_68 [2];
  double local_58;
  Point3<double> local_50;
  Point3<double> *in_stack_ffffffffffffffc8;
  Transform *in_stack_ffffffffffffffd0;
  double local_8;
  
  Point3<double>::Point3(&local_50,0.0,0.0,0.0);
  Transform::operator()(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  dVar3 = distanceSquared<double>(in_stack_ffffffffffffff90,in_RDI);
  if (in_RDI[1].y * in_RDI[1].y < dVar3) {
    dVar3 = in_RDI[1].y;
    dVar1 = in_RDI[1].y;
    local_58 = distanceSquared<double>(in_stack_ffffffffffffff90,in_RDI);
    local_58 = (dVar3 * dVar1) / local_58;
    local_68[0] = 0.0;
    pdVar2 = std::max<double>(local_68,(double *)&stack0xffffffffffffff90);
    dVar3 = sqrt(*pdVar2);
    local_8 = (1.0 - dVar3) * 6.283185307179586;
  }
  else {
    local_8 = 12.566370614359172;
  }
  return local_8;
}

Assistant:

Real Sphere::solidAngle(const Point3f& p, int nSamples) const {
    Point3f pCenter = (*localToWorld)(Point3f(0, 0, 0));
    if (distanceSquared(p, pCenter) <= radius * radius) return 4 * Pi;

    Real sinTheta2 = radius * radius / distanceSquared(p, pCenter);
    Real cosTheta = std::sqrt(std::max((Real)0, 1 - sinTheta2));
    return (2 * Pi * (1 - cosTheta));
}